

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testbitmap.c
# Opt level: O2

int main(int argc,char **argv)

{
  char *__s1;
  bool bVar1;
  FILE *pFVar2;
  Uint8 UVar3;
  undefined2 uVar4;
  int iVar5;
  uint uVar6;
  int extraout_EAX;
  SDL_Surface *pSVar7;
  SDL_Surface *pSVar8;
  undefined8 uVar9;
  long lVar10;
  ulong uVar11;
  void *__s;
  int iVar12;
  SDL_Rect dst;
  SDL_Event event;
  SDL_Color palette [256];
  
  uVar11 = (ulong)(uint)argc;
  iVar5 = SDL_Init(0x20);
  pFVar2 = _stderr;
  if (iVar5 < 0) {
    uVar9 = SDL_GetError();
    fprintf(pFVar2,"Couldn\'t initialize SDL: %s\n",uVar9);
    return 1;
  }
  uVar6 = 0;
  do {
    uVar11 = uVar11 & 0xffffffff;
    while( true ) {
      if ((int)uVar11 < 2) {
        pSVar7 = (SDL_Surface *)SDL_SetVideoMode(0x280,0x1e0,uVar6 & 0xff);
        pFVar2 = _stderr;
        if (pSVar7 == (SDL_Surface *)0x0) {
          uVar9 = SDL_GetError();
          fprintf(pFVar2,"Couldn\'t set 640x480x%d video mode: %s\n",(ulong)(uVar6 & 0xff),uVar9);
        }
        else {
          if ((char)uVar6 == '\b') {
            UVar3 = 0xff;
            for (lVar10 = 0; lVar10 != 0x100; lVar10 = lVar10 + 1) {
              palette[lVar10].r = UVar3;
              palette[lVar10].g = UVar3;
              palette[lVar10].b = UVar3;
              UVar3 = UVar3 + 0xff;
            }
            SDL_SetColors(pSVar7,palette,0,0x100);
          }
          iVar5 = SDL_LockSurface(pSVar7);
          pFVar2 = _stderr;
          if (-1 < iVar5) {
            __s = pSVar7->pixels;
            if (pSVar7->format->BytesPerPixel == '\x02') {
              for (iVar5 = 0; iVar5 < pSVar7->h; iVar5 = iVar5 + 1) {
                uVar6 = (iVar5 * 0xff) / pSVar7->h & 0xff;
                uVar4 = SDL_MapRGB(pSVar7->format,uVar6,uVar6,uVar6);
                uVar6 = pSVar7->w;
                if (pSVar7->w < 1) {
                  uVar6 = 0;
                }
                for (uVar11 = 0; uVar6 != uVar11; uVar11 = uVar11 + 1) {
                  *(undefined2 *)((long)__s + uVar11 * 2) = uVar4;
                }
                __s = (void *)((long)__s + (ulong)pSVar7->pitch);
              }
            }
            else {
              iVar5 = 0;
              for (iVar12 = 0; iVar12 < pSVar7->h; iVar12 = iVar12 + 1) {
                memset(__s,iVar5 / pSVar7->h,(ulong)pSVar7->pitch);
                __s = (void *)((long)__s + (ulong)pSVar7->pitch);
                iVar5 = iVar5 + 0xff;
              }
            }
            SDL_UnlockSurface(pSVar7);
            bVar1 = false;
            pSVar8 = pSVar7;
            SDL_UpdateRect(pSVar7,0,0,0,0);
            pSVar8 = LoadXBM(pSVar8,0x20,0x20,(Uint8 *)picture_bits);
            if (pSVar8 != (SDL_Surface *)0x0) {
              while (!bVar1) {
                bVar1 = false;
                while (iVar5 = SDL_PollEvent(&event), iVar5 != 0) {
                  if (event.type == '\x05') {
                    dst.x = (short)(pSVar8->w / -2) + event.motion.x;
                    dst.y = (short)(pSVar8->h / -2) + event.motion.y;
                    dst.w = (Uint16)pSVar8->w;
                    dst.h = (Uint16)pSVar8->h;
                    SDL_UpperBlit(pSVar8,0,pSVar7,&dst);
                    SDL_UpdateRects(pSVar7,1,&dst);
                  }
                  else if ((event.type == '\x02') || (event.type == '\f')) {
                    bVar1 = true;
                  }
                }
              }
              SDL_FreeSurface(pSVar8);
              SDL_Quit();
              return 0;
            }
            goto LAB_001016b3;
          }
          uVar9 = SDL_GetError();
          fprintf(pFVar2,"Couldn\'t lock the display surface: %s\n",uVar9);
        }
        iVar5 = 2;
        goto LAB_001016b5;
      }
      iVar5 = strcmp(argv[uVar11 - 2],"-bpp");
      __s1 = argv[(int)uVar11 - 1];
      if (iVar5 != 0) break;
      uVar6 = atoi(__s1);
      uVar11 = uVar11 - 2;
    }
    iVar5 = strcmp(__s1,"-warp");
    if (((iVar5 != 0) && (iVar5 = strcmp(__s1,"-hw"), iVar5 != 0)) &&
       (iVar5 = strcmp(__s1,"-fullscreen"), iVar5 != 0)) {
      fprintf(_stderr,"Usage: %s [-bpp N] [-warp] [-hw] [-fullscreen]\n",*argv);
LAB_001016b3:
      iVar5 = 1;
LAB_001016b5:
      quit(iVar5);
      return extraout_EAX;
    }
    uVar11 = uVar11 - 1;
  } while( true );
}

Assistant:

int main(int argc, char *argv[])
{
	SDL_Surface *screen;
	SDL_Surface *bitmap;
	Uint8  video_bpp;
	Uint32 videoflags;
	Uint8 *buffer;
	int i, k, done;
	SDL_Event event;
	Uint16 *buffer16;
        Uint16 color;
        Uint8  gradient;
	SDL_Color palette[256];


	/* Initialize SDL */
	if ( SDL_Init(SDL_INIT_VIDEO) < 0 ) {
		fprintf(stderr, "Couldn't initialize SDL: %s\n",SDL_GetError());
		return(1);
	}

	video_bpp = 0;
	videoflags = SDL_SWSURFACE;
	while ( argc > 1 ) {
		--argc;
		if ( strcmp(argv[argc-1], "-bpp") == 0 ) {
			video_bpp = atoi(argv[argc]);
			--argc;
		} else
		if ( strcmp(argv[argc], "-warp") == 0 ) {
			videoflags |= SDL_HWPALETTE;
		} else
		if ( strcmp(argv[argc], "-hw") == 0 ) {
			videoflags |= SDL_HWSURFACE;
		} else
		if ( strcmp(argv[argc], "-fullscreen") == 0 ) {
			videoflags |= SDL_FULLSCREEN;
		} else {
			fprintf(stderr,
			"Usage: %s [-bpp N] [-warp] [-hw] [-fullscreen]\n",
								argv[0]);
			quit(1);
		}
	}

	/* Set 640x480 video mode */
	if ( (screen=SDL_SetVideoMode(640,480,video_bpp,videoflags)) == NULL ) {
		fprintf(stderr, "Couldn't set 640x480x%d video mode: %s\n",
						video_bpp, SDL_GetError());
		quit(2);
	}

	if (video_bpp==8) {
		/* Set a gray colormap, reverse order from white to black */
		for ( i=0; i<256; ++i ) {
			palette[i].r = 255-i;
			palette[i].g = 255-i;
			palette[i].b = 255-i;
		}
		SDL_SetColors(screen, palette, 0, 256);
	}

	/* Set the surface pixels and refresh! */
	if ( SDL_LockSurface(screen) < 0 ) {
		fprintf(stderr, "Couldn't lock the display surface: %s\n",
							SDL_GetError());
		quit(2);
	}
	buffer=(Uint8 *)screen->pixels;
	if (screen->format->BytesPerPixel!=2) {
        	for ( i=0; i<screen->h; ++i ) {
        		memset(buffer,(i*255)/screen->h, screen->pitch);
        		buffer += screen->pitch;
        	}
        }
        else
        {
		for ( i=0; i<screen->h; ++i ) {
			gradient=((i*255)/screen->h);
                        color = SDL_MapRGB(screen->format, gradient, gradient, gradient);
                        buffer16=(Uint16*)buffer;
                        for (k=0; k<screen->w; k++)
                        {
                            *(buffer16+k)=color;
                        }
			buffer += screen->pitch;
		}
        }
	SDL_UnlockSurface(screen);
	SDL_UpdateRect(screen, 0, 0, 0, 0);

	/* Load the bitmap */
	bitmap = LoadXBM(screen, picture_width, picture_height,
					(Uint8 *)picture_bits);
	if ( bitmap == NULL ) {
		quit(1);
	}

	/* Wait for a keystroke */
	done = 0;
	while ( !done ) {
		/* Check for events */
		while ( SDL_PollEvent(&event) ) {
			switch (event.type) {
				case SDL_MOUSEBUTTONDOWN: {
					SDL_Rect dst;

					dst.x = event.button.x - bitmap->w/2;
					dst.y = event.button.y - bitmap->h/2;
					dst.w = bitmap->w;
					dst.h = bitmap->h;
					SDL_BlitSurface(bitmap, NULL,
								screen, &dst);
					SDL_UpdateRects(screen,1,&dst);
					}
					break;
				case SDL_KEYDOWN:
					/* Any key press quits the app... */
					done = 1;
					break;
				case SDL_QUIT:
					done = 1;
					break;
				default:
					break;
			}
		}
	}
	SDL_FreeSurface(bitmap);
	SDL_Quit();
	return(0);
}